

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

FaceData * __thiscall
Ptex::v2_4::PtexReader::PackedFace::reduce
          (PackedFace *this,PtexReader *r,Res newres,ReduceFn *reducefn,size_t *newMemUsed)

{
  byte bVar1;
  uint16_t uVar2;
  DataType DVar3;
  int iVar4;
  FaceData *pFVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  
  DVar3 = (r->_header).datatype;
  uVar2 = (r->_header).nchannels;
  iVar4 = *(int *)&(this->super_FaceData).field_0xc;
  pFVar5 = (FaceData *)operator_new(0x18);
  pFVar5->_res = newres;
  (pFVar5->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PackedFace_0011d598;
  *(int *)&pFVar5->field_0xc = iVar4;
  uVar7 = (ulong)(((1 << (newres.ulog2 & 0x1fU)) << (newres.vlog2 & 0x1fU)) * iVar4);
  pp_Var6 = (_func_int **)operator_new__(uVar7);
  pFVar5[1].super_PtexFaceData._vptr_PtexFaceData = pp_Var6;
  *newMemUsed = uVar7 + 0x18;
  bVar1 = (this->super_FaceData)._res.ulog2;
  (*reducefn)(this->_data,iVar4 << (bVar1 & 0x1f),1 << (bVar1 & 0x1f),
              1 << ((this->super_FaceData)._res.vlog2 & 0x1fU),pp_Var6,
              iVar4 << (newres.ulog2 & 0x1fU),DVar3,(int)uVar2);
  return pFVar5;
}

Assistant:

PtexReader::FaceData*
PtexReader::PackedFace::reduce(PtexReader* r, Res newres, PtexUtils::ReduceFn reducefn,
                               size_t& newMemUsed)
{
    // allocate a new face and reduce image
    DataType dt = r->datatype();
    int nchan = r->nchannels();
    int memsize = _pixelsize * newres.size();
    PackedFace* pf = new PackedFace(newres, _pixelsize, memsize);
    newMemUsed = sizeof(PackedFace) + memsize;
    // reduce and copy into new face
    reducefn(_data, _pixelsize * _res.u(), _res.u(), _res.v(),
             pf->_data, _pixelsize * newres.u(), dt, nchan);
    return pf;
}